

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FullPivHouseholderQR.h
# Opt level: O0

void __thiscall
Eigen::FullPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
FullPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (FullPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *matrix)

{
  long *plVar1;
  Index size;
  EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *matrix_00;
  Index local_70;
  Index local_68;
  Index local_60;
  Index local_58;
  Index local_50;
  Index local_48 [3];
  Index local_30;
  Index local_28;
  Index local_20;
  EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_18;
  EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *matrix_local;
  FullPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_local;
  
  local_18 = matrix;
  matrix_local = (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
  local_20 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(matrix);
  local_28 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(local_18);
  Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)this,&local_20,&local_28);
  local_30 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(local_18);
  local_48[0] = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(local_18);
  plVar1 = std::min<long>(&local_30,local_48);
  Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)(this + 0x18),plVar1);
  local_50 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(local_18);
  local_58 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(local_18);
  plVar1 = std::min<long>(&local_50,&local_58);
  Matrix<long,_1,_-1,_1,_1,_-1>::Matrix<long>((Matrix<long,_1,__1,_1,_1,__1> *)(this + 0x28),plVar1)
  ;
  local_60 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(local_18);
  local_68 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(local_18);
  plVar1 = std::min<long>(&local_60,&local_68);
  Matrix<long,_1,_-1,_1,_1,_-1>::Matrix<long>((Matrix<long,_1,__1,_1,_1,__1> *)(this + 0x38),plVar1)
  ;
  size = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(local_18);
  PermutationMatrix<-1,_-1,_int>::PermutationMatrix
            ((PermutationMatrix<_1,__1,_int> *)(this + 0x48),size);
  local_70 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(local_18);
  Matrix<double,_1,_-1,_1,_1,_-1>::Matrix<long>
            ((Matrix<double,_1,__1,_1,_1,__1> *)(this + 0x58),&local_70);
  this[0x68] = (FullPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x0;
  this[0x69] = (FullPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x0;
  matrix_00 = (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived(local_18);
  compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>(this,matrix_00);
  return;
}

Assistant:

explicit FullPivHouseholderQR(const EigenBase<InputType>& matrix)
      : m_qr(matrix.rows(), matrix.cols()),
        m_hCoeffs((std::min)(matrix.rows(), matrix.cols())),
        m_rows_transpositions((std::min)(matrix.rows(), matrix.cols())),
        m_cols_transpositions((std::min)(matrix.rows(), matrix.cols())),
        m_cols_permutation(matrix.cols()),
        m_temp(matrix.cols()),
        m_isInitialized(false),
        m_usePrescribedThreshold(false)
    {
      compute(matrix.derived());
    }